

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O3

void __thiscall cmDepends::SetIncludePathFromLanguage(cmDepends *this,string *lang)

{
  cmMakefile *this_00;
  char *pcVar1;
  size_t sVar2;
  string includePathVar;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_48,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_48);
  this_00 = this->LocalGenerator->Makefile;
  pcVar1 = cmMakefile::GetDefinition(this_00,&local_48);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)local_48._M_string_length,0x503895);
    std::__cxx11::string::_M_append((char *)&local_48,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_48);
    pcVar1 = cmMakefile::GetDefinition(this_00,&local_48);
    if (pcVar1 == (char *)0x0) goto LAB_0042ab90;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    sVar2 = strlen(pcVar1);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar1,pcVar1 + sVar2);
    cmSystemTools::ExpandListArgument(&local_68,&this->IncludePath,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0042ab90;
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    sVar2 = strlen(pcVar1);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar1,pcVar1 + sVar2);
    cmSystemTools::ExpandListArgument(&local_68,&this->IncludePath,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0042ab90;
  }
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
LAB_0042ab90:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmDepends::SetIncludePathFromLanguage(const std::string& lang)
{
  // Look for the new per "TARGET_" variant first:
  const char * includePath = 0;
  std::string includePathVar = "CMAKE_";
  includePathVar += lang;
  includePathVar += "_TARGET_INCLUDE_PATH";
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  includePath = mf->GetDefinition(includePathVar);
  if(includePath)
    {
    cmSystemTools::ExpandListArgument(includePath, this->IncludePath);
    }
  else
    {
    // Fallback to the old directory level variable if no per-target var:
    includePathVar = "CMAKE_";
    includePathVar += lang;
    includePathVar += "_INCLUDE_PATH";
    includePath = mf->GetDefinition(includePathVar);
    if(includePath)
      {
      cmSystemTools::ExpandListArgument(includePath, this->IncludePath);
      }
    }
}